

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGLDriver::draw2DVertexPrimitiveList
          (COpenGLDriver *this,void *vertices,u32 vertexCount,void *indexList,u32 primitiveCount,
          E_VERTEX_TYPE vType,E_PRIMITIVE_TYPE pType,E_INDEX_TYPE iType)

{
  E_MATERIAL_TYPE EVar1;
  f32 fVar2;
  ITexture *pIVar3;
  bool bVar4;
  byte bVar5;
  pointer puVar6;
  void *pvVar7;
  undefined8 uVar8;
  bool alpha;
  long lVar9;
  undefined4 uVar10;
  
  if (vertexCount == 0 || primitiveCount == 0) {
    return;
  }
  bVar4 = CNullDriver::checkPrimitiveCount(&this->super_CNullDriver,primitiveCount);
  if (!bVar4) {
    return;
  }
  CNullDriver::draw2DVertexPrimitiveList
            (&this->super_CNullDriver,vertices,vertexCount,indexList,primitiveCount,vType,pType,
             iType);
  if (((vertices != (void *)0x0) && (this->field_0x583 == '\0')) && (this->field_0x5f9 == '\0')) {
    getColorBuffer(this,vertices,vertexCount,vType);
  }
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  ::STextureCache::set
            (&(this->CacheHandler->
              super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              ).TextureCache,0,(this->Material).TextureLayers[0].Texture,EST_ACTIVE_ALWAYS);
  EVar1 = (this->Material).MaterialType;
  if (EVar1 == EMT_ONETEXTURE_BLEND) {
    fVar2 = (this->Material).MaterialTypeParam;
    alpha = (bool)((byte)((uint)fVar2 >> 0x14) & 1);
    pIVar3 = (this->Material).TextureLayers[0].Texture;
    bVar4 = (bool)((byte)((uint)fVar2 >> 0x15) & 1);
  }
  else {
    alpha = EVar1 == EMT_TRANSPARENT_VERTEX_ALPHA;
    pIVar3 = (this->Material).TextureLayers[0].Texture;
    bVar4 = EVar1 == EMT_TRANSPARENT_ALPHA_CHANNEL;
  }
  setRenderStates2DMode(this,alpha,pIVar3 != (ITexture *)0x0,bVar4);
  COpenGLCacheHandler::setClientState
            (this->CacheHandler,true,false,true,pType != EPT_POINTS && pType != EPT_POINT_SPRITES);
  bVar5 = this->field_0x5f9 | this->field_0x583;
  uVar10 = 4;
  if ((bVar5 & 1) != 0) {
    uVar10 = 0x80e1;
  }
  if (vertices != (void *)0x0) {
    if ((bVar5 & 1) == 0) {
      puVar6 = (this->ColorBuffer).m_data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
    }
    else if (vType == EVT_TANGENTS) {
      puVar6 = (pointer)((long)vertices + 0x18);
      uVar8 = 0x3c;
    }
    else if (vType == EVT_2TCOORDS) {
      puVar6 = (pointer)((long)vertices + 0x18);
      uVar8 = 0x2c;
    }
    else {
      if (vType != EVT_STANDARD) goto LAB_001e3f3f;
      puVar6 = (pointer)((long)vertices + 0x18);
      uVar8 = 0x24;
    }
    glColorPointer(uVar10,0x1401,uVar8,puVar6);
  }
  if (vType == EVT_TANGENTS) {
    if (vertices == (void *)0x0) {
      glColorPointer(uVar10,0x1401,0x3c,0x18);
      glTexCoordPointer(2,0x1406,0x3c,0x1c);
      vertices = (void *)0x0;
    }
    else {
      glTexCoordPointer(2,0x1406,0x3c,(long)vertices + 0x1c);
    }
    glVertexPointer(2,0x1406,0x3c,vertices);
    goto LAB_001e3f3f;
  }
  if (vType == EVT_2TCOORDS) {
    if (vertices == (void *)0x0) {
      glColorPointer(uVar10,0x1401,0x2c,0x18);
      glTexCoordPointer(2,0x1406,0x2c,0x1c);
      pvVar7 = (void *)0x0;
    }
    else {
      glTexCoordPointer(2,0x1406,0x2c,(long)vertices + 0x1c);
      pvVar7 = vertices;
    }
    glVertexPointer(2,0x1406,0x2c,pvVar7);
    if (this->field_0x6c3 == '\0') goto LAB_001e3f3f;
    COpenGLCacheHandler::setClientActiveTexture(this->CacheHandler,0x84c1);
    glEnableClientState(0x8078);
    if (vertices == (void *)0x0) {
      lVar9 = 0x24;
      uVar8 = 0x2c;
    }
    else {
      lVar9 = (long)vertices + 0x24;
      uVar8 = 0x2c;
    }
  }
  else {
    if (vType != EVT_STANDARD) goto LAB_001e3f3f;
    if (vertices == (void *)0x0) {
      glColorPointer(uVar10,0x1401,0x24,0x18);
      glTexCoordPointer(2,0x1406,0x24,0x1c);
      pvVar7 = (void *)0x0;
    }
    else {
      glTexCoordPointer(2,0x1406,0x24,(long)vertices + 0x1c);
      pvVar7 = vertices;
    }
    glVertexPointer(2,0x1406,0x24,pvVar7);
    if ((this->field_0x6c3 == '\0') ||
       ((this->CacheHandler->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).TextureCache.Texture[1] == (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0))
    goto LAB_001e3f3f;
    COpenGLCacheHandler::setClientActiveTexture(this->CacheHandler,0x84c1);
    glEnableClientState(0x8078);
    if (vertices == (void *)0x0) {
      lVar9 = 0x1c;
      uVar8 = 0x24;
    }
    else {
      lVar9 = (long)vertices + 0x1c;
      uVar8 = 0x24;
    }
  }
  glTexCoordPointer(2,0x1406,uVar8,lVar9);
LAB_001e3f3f:
  renderArray(this,indexList,primitiveCount,pType,iType);
  if (this->field_0x6c3 == '\0') {
    return;
  }
  if ((vType != EVT_STANDARD) ||
     ((this->CacheHandler->
      super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ).TextureCache.Texture[1] != (COpenGLCoreTexture<irr::video::COpenGLDriver> *)0x0)) {
    COpenGLCacheHandler::setClientActiveTexture(this->CacheHandler,0x84c1);
    glDisableClientState(0x8078);
  }
  COpenGLCacheHandler::setClientActiveTexture(this->CacheHandler,0x84c0);
  return;
}

Assistant:

void COpenGLDriver::draw2DVertexPrimitiveList(const void *vertices, u32 vertexCount,
		const void *indexList, u32 primitiveCount,
		E_VERTEX_TYPE vType, scene::E_PRIMITIVE_TYPE pType, E_INDEX_TYPE iType)
{
	if (!primitiveCount || !vertexCount)
		return;

	if (!checkPrimitiveCount(primitiveCount))
		return;

	CNullDriver::draw2DVertexPrimitiveList(vertices, vertexCount, indexList, primitiveCount, vType, pType, iType);

	if (vertices && !FeatureAvailable[IRR_ARB_vertex_array_bgra] && !FeatureAvailable[IRR_EXT_vertex_array_bgra])
		getColorBuffer(vertices, vertexCount, vType);

	// draw everything
	CacheHandler->getTextureCache().set(0, Material.getTexture(0));
	if (Material.MaterialType == EMT_ONETEXTURE_BLEND) {
		E_BLEND_FACTOR srcFact;
		E_BLEND_FACTOR dstFact;
		E_MODULATE_FUNC modulo;
		u32 alphaSource;
		unpack_textureBlendFunc(srcFact, dstFact, modulo, alphaSource, Material.MaterialTypeParam);
		setRenderStates2DMode(alphaSource & video::EAS_VERTEX_COLOR, (Material.getTexture(0) != 0), (alphaSource & video::EAS_TEXTURE) != 0);
	} else
		setRenderStates2DMode(Material.MaterialType == EMT_TRANSPARENT_VERTEX_ALPHA, (Material.getTexture(0) != 0), Material.MaterialType == EMT_TRANSPARENT_ALPHA_CHANNEL);

	if ((pType != scene::EPT_POINTS) && (pType != scene::EPT_POINT_SPRITES))
		CacheHandler->setClientState(true, false, true, true);
	else
		CacheHandler->setClientState(true, false, true, false);

// due to missing defines in OSX headers, we have to be more specific with this check
// #if defined(GL_ARB_vertex_array_bgra) || defined(GL_EXT_vertex_array_bgra)
#ifdef GL_BGRA
	const GLint colorSize = (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) ? GL_BGRA : 4;
#else
	const GLint colorSize = 4;
#endif
	if (vertices) {
		if (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) {
			switch (vType) {
			case EVT_STANDARD:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].Color);
				break;
			case EVT_2TCOORDS:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].Color);
				break;
			case EVT_TANGENTS:
				glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].Color);
				break;
			}
		} else {
			// avoid passing broken pointer to OpenGL
			_IRR_DEBUG_BREAK_IF(ColorBuffer.size() == 0);
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, 0, &ColorBuffer[0]);
		}
	}

	switch (vType) {
	case EVT_STANDARD:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), 0);
		}

		if (Feature.MaxTextureUnits > 0 && CacheHandler->getTextureCache()[1]) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glEnableClientState(GL_TEXTURE_COORD_ARRAY);
			if (vertices)
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(vertices))[0].TCoords);
			else
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex), buffer_offset(28));
		}
		break;
	case EVT_2TCOORDS:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex2TCoords), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(0));
		}

		if (Feature.MaxTextureUnits > 0) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glEnableClientState(GL_TEXTURE_COORD_ARRAY);
			if (vertices)
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), &(static_cast<const S3DVertex2TCoords *>(vertices))[0].TCoords2);
			else
				glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertex2TCoords), buffer_offset(36));
		}
		break;
	case EVT_TANGENTS:
		if (vertices) {
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].TCoords);
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), &(static_cast<const S3DVertexTangents *>(vertices))[0].Pos);
		} else {
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertexTangents), buffer_offset(24));
			glTexCoordPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), buffer_offset(28));
			glVertexPointer(2, GL_FLOAT, sizeof(S3DVertexTangents), buffer_offset(0));
		}

		break;
	}

	renderArray(indexList, primitiveCount, pType, iType);

	if (Feature.MaxTextureUnits > 0) {
		if ((vType != EVT_STANDARD) || CacheHandler->getTextureCache()[1]) {
			CacheHandler->setClientActiveTexture(GL_TEXTURE0 + 1);
			glDisableClientState(GL_TEXTURE_COORD_ARRAY);
		}
		CacheHandler->setClientActiveTexture(GL_TEXTURE0);
	}
}